

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

quat golf_json_object_get_quat(JSON_Object *obj,char *name)

{
  double dVar1;
  double dVar2;
  JSON_Array *array;
  quat qVar3;
  
  array = json_object_get_array(obj,name);
  dVar1 = json_array_get_number(array,0);
  dVar2 = json_array_get_number(array,1);
  qVar3.x = (float)dVar1;
  qVar3.y = (float)dVar2;
  dVar1 = json_array_get_number(array,2);
  dVar2 = json_array_get_number(array,3);
  qVar3.z = (float)dVar1;
  qVar3.w = (float)dVar2;
  return qVar3;
}

Assistant:

quat golf_json_object_get_quat(JSON_Object *obj, const char *name) {
    JSON_Array *array = json_object_get_array(obj, name);
    quat q;
    q.x = (float)json_array_get_number(array, 0);
    q.y = (float)json_array_get_number(array, 1);
    q.z = (float)json_array_get_number(array, 2);
    q.w = (float)json_array_get_number(array, 3);
    return q;
}